

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixClose(sqlite3_file *id)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  unixInodeInfo *pInode;
  unixFile *pFile;
  int rc;
  sqlite3_file *id_local;
  
  psVar1 = id[2].pMethods;
  verifyDbFile((unixFile *)id);
  unixUnlock(id,0);
  unixEnterMutex();
  sqlite3_mutex_enter((sqlite3_mutex *)psVar1->xRead);
  if (*(int *)((long)&psVar1->xWrite + 4) != 0) {
    setPendingFd((unixFile *)id);
  }
  sqlite3_mutex_leave((sqlite3_mutex *)psVar1->xRead);
  releaseInodeInfo((unixFile *)id);
  iVar2 = closeUnixFile(id);
  unixLeaveMutex();
  return iVar2;
}

Assistant:

static int unixClose(sqlite3_file *id){
  int rc = SQLITE_OK;
  unixFile *pFile = (unixFile *)id;
  unixInodeInfo *pInode = pFile->pInode;

  assert( pInode!=0 );
  verifyDbFile(pFile);
  unixUnlock(id, NO_LOCK);
  assert( unixFileMutexNotheld(pFile) );
  unixEnterMutex();

  /* unixFile.pInode is always valid here. Otherwise, a different close
  ** routine (e.g. nolockClose()) would be called instead.
  */
  assert( pFile->pInode->nLock>0 || pFile->pInode->bProcessLock==0 );
  sqlite3_mutex_enter(pInode->pLockMutex);
  if( pInode->nLock ){
    /* If there are outstanding locks, do not actually close the file just
    ** yet because that would clear those locks.  Instead, add the file
    ** descriptor to pInode->pUnused list.  It will be automatically closed 
    ** when the last lock is cleared.
    */
    setPendingFd(pFile);
  }
  sqlite3_mutex_leave(pInode->pLockMutex);
  releaseInodeInfo(pFile);
  rc = closeUnixFile(id);
  unixLeaveMutex();
  return rc;
}